

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

void Spl_ManStop(Spl_Man_t *p)

{
  Gia_Man_t *pGVar1;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Bit_t *pVVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  Gia_ManStaticFanoutStop(p->pGia);
  pGVar1 = p->pGia;
  if (pGVar1->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("!Gia_ManHasMapping(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                  ,0x99,"void Spl_ManStop(Spl_Man_t *)");
  }
  if (pGVar1->vMapping2 == (Vec_Wec_t *)0x0) {
    __assert_fail("Gia_ManHasMapping2(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                  ,0x9a,"void Spl_ManStop(Spl_Man_t *)");
  }
  pVVar4 = Spl_ManFromWecMapping(pGVar1,pGVar1->vMapping2);
  pGVar1 = p->pGia;
  pGVar1->vMapping = pVVar4;
  __ptr = pGVar1->vMapping2;
  if (__ptr == (Vec_Wec_t *)0x0) goto LAB_007cb21c;
  iVar5 = __ptr->nCap;
  pVVar4 = __ptr->pArray;
  if (iVar5 < 1) {
    if (pVVar4 != (Vec_Int_t *)0x0) goto LAB_007cb204;
  }
  else {
    lVar6 = 8;
    lVar7 = 0;
    do {
      __ptr_00 = *(void **)((long)&pVVar4->nCap + lVar6);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        pVVar4 = __ptr->pArray;
        *(undefined8 *)((long)&pVVar4->nCap + lVar6) = 0;
        iVar5 = __ptr->nCap;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < iVar5);
LAB_007cb204:
    free(pVVar4);
  }
  free(__ptr);
  pGVar1->vMapping2 = (Vec_Wec_t *)0x0;
LAB_007cb21c:
  pVVar2 = p->vMarksCIO;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vMarksIn;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vMarksNo;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar2 = p->vMarksAnd;
  piVar3 = pVVar2->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar2);
  pVVar4 = p->vRoots;
  piVar3 = pVVar4->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar4);
  pVVar4 = p->vNodes;
  piVar3 = pVVar4->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar4);
  pVVar4 = p->vLeaves;
  piVar3 = pVVar4->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar4);
  pVVar4 = p->vAnds;
  piVar3 = pVVar4->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar4);
  pVVar4 = p->vFanouts;
  piVar3 = pVVar4->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar4);
  pVVar4 = p->vCands;
  piVar3 = pVVar4->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar4);
  pVVar4 = p->vInputs;
  piVar3 = pVVar4->pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  free(pVVar4);
  free(p);
  return;
}

Assistant:

void Spl_ManStop( Spl_Man_t * p )
{
    // fanout
    Gia_ManStaticFanoutStop( p->pGia );
    // mapping
    assert( !Gia_ManHasMapping(p->pGia) );
    assert( Gia_ManHasMapping2(p->pGia) );
    p->pGia->vMapping = Spl_ManFromWecMapping( p->pGia, p->pGia->vMapping2 );
    Vec_WecFreeP( &p->pGia->vMapping2 );
    // intermediate
    Vec_BitFree( p->vMarksCIO );
    Vec_BitFree( p->vMarksIn );
    Vec_BitFree( p->vMarksNo );
    Vec_BitFree( p->vMarksAnd );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vNodes );
    Vec_IntFree( p->vLeaves );
    Vec_IntFree( p->vAnds );
    // temporary 
    Vec_IntFree( p->vFanouts );
    Vec_IntFree( p->vCands );
    Vec_IntFree( p->vInputs );
    ABC_FREE( p );
}